

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall
Table_TableCanBeWrappedWithSpacesAndComments_Test::
~Table_TableCanBeWrappedWithSpacesAndComments_Test
          (Table_TableCanBeWrappedWithSpacesAndComments_Test *this)

{
  Table_TableCanBeWrappedWithSpacesAndComments_Test *this_local;
  
  ~Table_TableCanBeWrappedWithSpacesAndComments_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Table, TableCanBeWrappedWithSpacesAndComments) {
    std::istringstream input("\r\n   \n  \t    [table.123.\"table\\ntable\"]   # comment\r\n\n");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table, {"table", "123", "table\ntable"}},
        {sax_event_t::comment, " comment"},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}